

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall
UI::renderMessages(UI *this,
                  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *messages,
                  int width,bool isThread)

{
  int *piVar1;
  int iVar2;
  pointer pUVar3;
  ImVec2 IVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ImU32 col;
  ImDrawList *this_00;
  ImGuiIO *pIVar11;
  undefined7 in_register_00000009;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  pointer pMVar19;
  long lVar20;
  uint uVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  string curDate;
  ImVec2 p0;
  ImVec2 p1;
  string lastDate;
  ImVec2 local_108;
  undefined1 local_100 [8];
  size_t local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  ImVec2 local_e0;
  UI *local_d8;
  undefined4 local_cc;
  ImVec4 *local_c8;
  float local_c0;
  int local_bc;
  ImVec2 local_b8;
  ImVec4 *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImVec2 local_98;
  float local_8c;
  undefined1 local_88 [16];
  ImVec4 *local_78;
  ImVec4 *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ImVec4 *local_48;
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *local_40;
  long local_38;
  
  local_cc = (undefined4)CONCAT71(in_register_00000009,isThread);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_d8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  ImGui::PushTextWrapPos((float)(width + -4));
  pMVar19 = (messages->super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(messages->
                              super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar19) >> 3) *
          0x38e38e39) {
    local_b0 = &(local_d8->colors).messageUser;
    local_78 = &(local_d8->colors).messageTime;
    local_c8 = &(local_d8->colors).messageReact;
    local_70 = &(local_d8->colors).messageReplies;
    if ((char)local_cc == '\0') {
      local_c0 = 12.0;
    }
    else {
      local_c0 = 7.0;
    }
    local_bc = width / 2;
    local_8c = (float)width;
    local_48 = &(local_d8->colors).messageHovered;
    local_a8.x = -NAN;
    lVar18 = 0;
    local_40 = messages;
    do {
      iVar2 = pMVar19[lVar18].msg.uid;
      pUVar3 = (local_d8->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.
               super__Vector_impl_data._M_start;
      ImGui::PushID((int)lVar18);
      pMVar19 = pMVar19 + lVar18;
      local_38 = lVar18 * 9;
      tToDate_abi_cxx11_((string *)local_100,(pMVar19->msg).t_s);
      sVar5 = local_f8;
      if (local_f8 == local_68._M_string_length) {
        if (local_f8 != 0) {
          iVar9 = bcmp((void *)local_100,local_68._M_dataplus._M_p,local_f8);
          if (iVar9 != 0) goto LAB_00117e50;
        }
      }
      else {
LAB_00117e50:
        ImGui::Text("%s","");
        local_88._0_8_ = pMVar19;
        uVar16 = ~(uint)(sVar5 + 6 >> 1) + local_bc;
        uVar10 = 0xff;
        if ((int)uVar16 < 0xff) {
          uVar10 = uVar16;
        }
        uVar21 = 0;
        if (0 < (int)uVar10) {
          uVar21 = uVar10;
        }
        if (0 < (int)uVar16) {
          memset(renderSeparator::buf,0x2d,(ulong)uVar10);
        }
        renderSeparator::buf[uVar21] = '\0';
        ImGui::TextDisabled("%s%s%s","",renderSeparator::buf);
        pMVar19 = (pointer)local_88._0_8_;
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",local_100);
        ImGui::SameLine(0.0,-1.0);
        if (0 < (int)uVar16) {
          memset(renderSeparator::buf,0x2d,(ulong)uVar10);
        }
        renderSeparator::buf[uVar21] = '\0';
        ImGui::TextDisabled("%s%s%s","",renderSeparator::buf);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
      }
      if (local_100 != (undefined1  [8])&local_f0) {
        operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
      }
      IVar4 = ImGui::GetCursorScreenPos();
      local_88._8_4_ = extraout_XMM0_Dc;
      local_88._0_4_ = IVar4.x;
      local_88._4_4_ = IVar4.y;
      local_88._12_4_ = extraout_XMM0_Dd;
      IVar4 = ImGui::GetCursorScreenPos();
      local_e0.y = IVar4.y;
      local_e0.x = (float)local_88._0_4_;
      if (local_a8.x != (float)(pMVar19->msg).uid) {
        ImGui::Text("%s","");
        ImGui::TextColored(local_b0,"%s",pUVar3[iVar2].username._M_dataplus._M_p);
        ImGui::SameLine(0.0,-1.0);
        tToTime_abi_cxx11_((string *)local_100,(pMVar19->msg).t_s);
        ImGui::TextColored(local_78,"%s",local_100);
        if (local_100 != (undefined1  [8])&local_f0) {
          operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
        }
      }
      ImGui::Text("%s",(pMVar19->msg).text._M_dataplus._M_p);
      if (0 < (pMVar19->msg).reactUp) {
        ImGui::TextColored(local_c8,"%s","[+]");
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%d",(ulong)(uint)(pMVar19->msg).reactUp);
      }
      if (0 < (pMVar19->msg).reactDown) {
        if (0 < (pMVar19->msg).reactUp) {
          ImGui::SameLine(0.0,-1.0);
        }
        ImGui::TextColored(local_c8,"%s","[-]");
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%d",(ulong)(uint)(pMVar19->msg).reactDown);
      }
      if (*(pointer *)
           ((long)&(pMVar19->replies).
                   super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                   _M_impl + 8) !=
          (pMVar19->replies).
          super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
          super__Vector_impl_data._M_start) {
        if ((0 < (pMVar19->msg).reactUp) || (0 < (pMVar19->msg).reactDown)) {
          ImGui::SameLine(0.0,-1.0);
          ImGui::Text("|");
          ImGui::SameLine(0.0,-1.0);
        }
        ImGui::TextColored(local_70,"%d replies",
                           (ulong)(uint)((int)((ulong)((long)*(pointer *)
                                                              ((long)&(pMVar19->replies).
                                                                                                                                            
                                                  super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                                  ._M_impl + 8) -
                                                  *(long *)&(pMVar19->replies).
                                                                                                                        
                                                  super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                                  ._M_impl.super__Vector_impl_data) >> 3) *
                                        0x38e38e39));
      }
      IVar4 = ImGui::GetCursorScreenPos();
      local_88._8_4_ = extraout_XMM0_Dc_00;
      local_88._0_4_ = IVar4.x;
      local_88._4_4_ = IVar4.y;
      local_88._12_4_ = extraout_XMM0_Dd_00;
      IVar4 = ImGui::GetCursorScreenPos();
      local_b8.y = IVar4.y;
      local_b8.x = (float)local_88._0_4_ + local_8c;
      bVar6 = ImGui::IsWindowHovered(0);
      bVar15 = 1;
      if (bVar6) {
        bVar6 = ImGui::IsMouseHoveringRect(&local_e0,&local_b8,true);
        if (!bVar6) goto LAB_001186f8;
        this_00 = ImGui::GetWindowDrawList();
        local_100._4_4_ = local_e0.y + 1.0;
        local_100._0_4_ = local_e0.x;
        local_108.y = local_b8.y + -1.0;
        local_108.x = local_b8.x;
        col = ImGui::ColorConvertFloat4ToU32(local_48);
        ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_100,&local_108,col,0.0,0xf);
        ImGui::SetCursorScreenPos(&local_e0);
        if (local_a8.x != (float)(pMVar19->msg).uid) {
          ImGui::Text("%s","");
          ImGui::TextColored(local_b0,"%s",pUVar3[iVar2].username._M_dataplus._M_p);
          ImGui::SameLine(0.0,-1.0);
          tToTime_abi_cxx11_((string *)local_100,(pMVar19->msg).t_s);
          ImGui::TextColored(local_78,"%s",local_100);
          if (local_100 != (undefined1  [8])&local_f0) {
            operator_delete((void *)local_100,local_f0._M_allocated_capacity + 1);
          }
        }
        ImGui::Text("%s");
        if (0 < (pMVar19->msg).reactUp) {
          ImGui::TextColored(local_c8,"%s","[+]");
          bVar6 = ImGui::IsItemHovered(0);
          if (bVar6) {
            pIVar11 = ImGui::GetIO();
            local_100._4_4_ = local_e0.y + -4.0;
            local_100._0_4_ = (pIVar11->MousePos).x + -10.0;
            local_108.x = 0.0;
            local_108.y = 0.0;
            ImGui::SetNextWindowPos((ImVec2 *)local_100,0,&local_108);
            local_100._0_4_ = 40.0;
            local_100._4_4_ = 0.0;
            ImGui::SetNextWindowSize((ImVec2 *)local_100,0);
            ImGui::BeginTooltip();
            ImGui::Text("%s","");
            ImGui::TextColored(local_c8,"%s","[+]");
            ImGui::Text("%s","");
            uVar10 = (pMVar19->msg).reactUp;
            uVar13 = (ulong)uVar10;
            if (0 < (int)uVar10) {
              uVar17 = 0;
              lVar20 = 0;
              do {
                pUVar3 = (local_d8->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar14 = uVar17 % (ulong)(((long)(local_d8->users).
                                                 super__Vector_base<User,_std::allocator<User>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                           (long)pUVar3 >> 5) * -0x5555555555555555);
                pcVar12 = ",";
                if (uVar17 == (int)uVar13 - 2) {
                  pcVar12 = " and";
                }
                if (uVar17 == (int)uVar13 - 1) {
                  pcVar12 = "";
                }
                ImGui::TextColored(local_b0,"%s%s",pUVar3[uVar14].username._M_dataplus._M_p,pcVar12)
                ;
                lVar20 = (long)(int)lVar20 + pUVar3[uVar14].username._M_string_length;
                if ((int)lVar20 < 0x14) {
                  ImGui::SameLine(0.0,-1.0);
                }
                else {
                  lVar20 = 0;
                }
                uVar17 = uVar17 + 1;
                uVar13 = (ulong)(pMVar19->msg).reactUp;
              } while ((long)uVar17 < (long)uVar13);
            }
            ImGui::Text("reacted with :+1:");
            ImGui::Text("%s","");
            ImGui::EndTooltip();
          }
          ImGui::SameLine(0.0,-1.0);
          ImGui::Text("%d");
        }
        if (0 < (pMVar19->msg).reactDown) {
          if (0 < (pMVar19->msg).reactUp) {
            ImGui::SameLine(0.0,-1.0);
          }
          ImGui::TextColored(local_c8,"%s","[-]");
          bVar6 = ImGui::IsItemHovered(0);
          if (bVar6) {
            pIVar11 = ImGui::GetIO();
            local_100._4_4_ = local_e0.y + -4.0;
            local_100._0_4_ = (pIVar11->MousePos).x + -10.0;
            local_108.x = 0.0;
            local_108.y = 0.0;
            ImGui::SetNextWindowPos((ImVec2 *)local_100,0,&local_108);
            local_100._0_4_ = 40.0;
            local_100._4_4_ = 0.0;
            ImGui::SetNextWindowSize((ImVec2 *)local_100,0);
            ImGui::BeginTooltip();
            ImGui::Text("%s","");
            ImGui::TextColored(local_c8,"%s","[-]");
            ImGui::Text("%s","");
            uVar10 = (pMVar19->msg).reactDown;
            uVar13 = (ulong)uVar10;
            if (0 < (int)uVar10) {
              uVar17 = 0;
              lVar20 = 0;
              do {
                pUVar3 = (local_d8->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar14 = uVar17 % (ulong)(((long)(local_d8->users).
                                                 super__Vector_base<User,_std::allocator<User>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                           (long)pUVar3 >> 5) * -0x5555555555555555);
                pcVar12 = ",";
                if (uVar17 == (int)uVar13 - 2) {
                  pcVar12 = " and";
                }
                if (uVar17 == (int)uVar13 - 1) {
                  pcVar12 = "";
                }
                ImGui::TextColored(local_b0,"%s%s",pUVar3[uVar14].username._M_dataplus._M_p,pcVar12)
                ;
                lVar20 = (long)(int)lVar20 + pUVar3[uVar14].username._M_string_length;
                if ((int)lVar20 < 0x14) {
                  ImGui::SameLine(0.0,-1.0);
                }
                else {
                  lVar20 = 0;
                }
                uVar17 = uVar17 + 1;
                uVar13 = (ulong)(pMVar19->msg).reactDown;
              } while ((long)uVar17 < (long)uVar13);
            }
            ImGui::Text("reacted with :-1:");
            ImGui::Text("%s","");
            ImGui::EndTooltip();
          }
          ImGui::SameLine(0.0,-1.0);
          ImGui::Text("%d");
        }
        if (*(pointer *)
             ((long)&(pMVar19->replies).
                     super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                     _M_impl + 8) ==
            (pMVar19->replies).
            super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
            super__Vector_impl_data._M_start) {
LAB_00118700:
          bVar6 = false;
        }
        else {
          if ((0 < (pMVar19->msg).reactUp) || (0 < (pMVar19->msg).reactDown)) {
            ImGui::SameLine(0.0,-1.0);
            ImGui::Text("|");
            ImGui::SameLine(0.0,-1.0);
          }
          ImGui::TextColored(local_70,"%d replies",
                             (ulong)(uint)((int)((ulong)((long)*(pointer *)
                                                                ((long)&(pMVar19->replies).
                                                                                                                                                
                                                  super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                                  ._M_impl + 8) -
                                                  *(long *)&(pMVar19->replies).
                                                                                                                        
                                                  super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                                  ._M_impl.super__Vector_impl_data) >> 3) *
                                          0x38e38e39));
          bVar6 = ImGui::IsItemHovered(0);
          if (!bVar6) goto LAB_00118700;
          ImGui::SameLine(0.0,-1.0);
          ImGui::SmallButton("View thread");
          bVar6 = ImGui::IsMouseDown(0);
        }
        local_100 = (undefined1  [8])ImGui::GetCursorScreenPos();
        local_108.y = local_e0.y;
        local_108.x = local_b8.x - local_c0;
        ImGui::SetCursorScreenPos(&local_108);
        ImGui::SmallButton("[+]");
        bVar7 = ImGui::IsItemHovered(0);
        if (bVar7) {
          bVar7 = ImGui::IsMouseReleased(0);
          pIVar11 = ImGui::GetIO();
          local_a8 = pIVar11->MousePos;
          uStack_a0._0_1_ = pIVar11->MouseDown[0];
          uStack_a0._1_1_ = pIVar11->MouseDown[1];
          uStack_a0._2_1_ = pIVar11->MouseDown[2];
          uStack_a0._3_1_ = pIVar11->MouseDown[3];
          uStack_a0._4_1_ = pIVar11->MouseDown[4];
          uStack_a0._5_3_ = *(undefined3 *)&pIVar11->field_0x12d;
          pIVar11 = ImGui::GetIO();
          local_108.y = (pIVar11->MousePos).y + -2.0;
          local_108.x = local_a8.x + -10.0;
          local_98.x = 0.0;
          local_98.y = 0.0;
          ImGui::SetNextWindowPos(&local_108,0,&local_98);
          ImGui::SetTooltip("React with +1");
        }
        else {
          bVar7 = false;
        }
        if ((char)local_cc == '\0') {
          ImGui::SameLine(0.0,-1.0);
          ImGui::SmallButton("[>]");
          bVar8 = ImGui::IsItemHovered(0);
          if (bVar8) {
            bVar8 = ImGui::IsMouseDown(0);
            if (bVar8) {
              bVar6 = true;
            }
            pIVar11 = ImGui::GetIO();
            local_a8 = pIVar11->MousePos;
            uStack_a0._0_1_ = pIVar11->MouseDown[0];
            uStack_a0._1_1_ = pIVar11->MouseDown[1];
            uStack_a0._2_1_ = pIVar11->MouseDown[2];
            uStack_a0._3_1_ = pIVar11->MouseDown[3];
            uStack_a0._4_1_ = pIVar11->MouseDown[4];
            uStack_a0._5_3_ = *(undefined3 *)&pIVar11->field_0x12d;
            pIVar11 = ImGui::GetIO();
            local_108.y = (pIVar11->MousePos).y + -2.0;
            local_108.x = local_a8.x + -16.0;
            local_98.x = 0.0;
            local_98.y = 0.0;
            ImGui::SetNextWindowPos(&local_108,0,&local_98);
            ImGui::SetTooltip("Reply in thread");
          }
        }
        ImGui::SetCursorScreenPos((ImVec2 *)local_100);
        bVar15 = bVar7 ^ 1;
      }
      else {
LAB_001186f8:
        bVar6 = false;
      }
      if (bVar15 == 0 && (char)local_cc == '\0') {
        piVar1 = (int *)(*(long *)&(local_d8->channels).
                                   super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                   super__Vector_impl_data._M_start[local_d8->selectedChannel].
                                   messages.
                                   super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                   ._M_impl.super__Vector_impl_data + 0x28 + local_38 * 8);
        *piVar1 = *piVar1 + 1;
      }
      if (bVar6 != false) {
        local_d8->showThreadPanel = true;
        local_d8->threadChannel = local_d8->selectedChannel;
        local_d8->threadMessage = (int)lVar18;
      }
      ImGui::PopID();
      local_a8.x = (float)(pMVar19->msg).uid;
      lVar18 = lVar18 + 1;
      pMVar19 = (local_40->
                super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>)._M_impl
                .super__Vector_impl_data._M_start;
    } while (lVar18 < (int)((ulong)((long)(local_40->
                                          super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pMVar19) >> 3) * 0x38e38e39);
  }
  ImGui::PopTextWrapPos();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool UI::renderMessages(const std::vector<MessageWithReplies> & messages, int width, bool isThread) {
    int32_t lastUid = -1;
    std::string lastDate = "";

    ImGui::PushTextWrapPos(width - 4);

    for (int i = 0; i < (int) messages.size(); i++) {
        const auto & message = messages[i];
        const auto & uid = message.msg.uid;
        const auto & user = users[uid];

        ImGui::PushID(i);

        // render new date separator
        {
            const auto curDate = tToDate(message.msg.t_s);
            if (curDate != lastDate) {
                const auto l = curDate.size() + 6;

                ImGui::Text("%s", "");
                renderSeparator("", "-", "", width/2 - l/2 - 1, true);
                ImGui::SameLine();
                ImGui::Text("%s", curDate.c_str());
                ImGui::SameLine();
                renderSeparator("", "-", "", width/2 - l/2 - 1, true);
                lastDate = curDate;
            }
        }

        const auto p0 = ImVec2 { ImGui::GetCursorScreenPos().x, ImGui::GetCursorScreenPos().y };

        if (lastUid != uid) {
            ImGui::Text("%s", "");
            ImGui::TextColored(colors.messageUser, "%s", user.username.c_str());
            ImGui::SameLine();
            ImGui::TextColored(colors.messageTime, "%s", tToTime(message.msg.t_s).c_str());
        }
        ImGui::Text("%s", message.msg.text.c_str());
        if (message.msg.reactUp > 0) {
            ImGui::TextColored(colors.messageReact, "%s", "[+]");
            ImGui::SameLine();
            ImGui::Text("%d", message.msg.reactUp);
        }

        if (message.msg.reactDown > 0) {
            if (message.msg.reactUp > 0) {
                ImGui::SameLine();
            }
            ImGui::TextColored(colors.messageReact, "%s", "[-]");
            ImGui::SameLine();
            ImGui::Text("%d", message.msg.reactDown);
        }

        if (message.replies.size() > 0) {
            if (message.msg.reactUp > 0 || message.msg.reactDown > 0) {
                ImGui::SameLine();
                ImGui::Text("|");
                ImGui::SameLine();
            }
            ImGui::TextColored(colors.messageReplies, "%d replies", (int) message.replies.size());
        }

        const auto p1 = ImVec2 { ImGui::GetCursorScreenPos().x + width, ImGui::GetCursorScreenPos().y };

        bool doUpvote = false;
        bool doReplyInThead = false;

        if (ImGui::IsWindowHovered() && ImGui::IsMouseHoveringRect(p0, p1)) {
            auto drawList = ImGui::GetWindowDrawList();

            drawList->AddRectFilled({ p0.x, p0.y + 1 }, { p1.x, p1.y - 1 }, ImGui::ColorConvertFloat4ToU32(colors.messageHovered));

            ImGui::SetCursorScreenPos(p0);

            if (lastUid != uid) {
                ImGui::Text("%s", "");
                ImGui::TextColored(colors.messageUser, "%s", user.username.c_str());
                ImGui::SameLine();
                ImGui::TextColored(colors.messageTime, "%s", tToTime(message.msg.t_s).c_str());
            }
            ImGui::Text("%s", message.msg.text.c_str());
            if (message.msg.reactUp > 0) {
                ImGui::TextColored(colors.messageReact, "%s", "[+]");
                if (ImGui::IsItemHovered()) {
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, p0.y - 4 });
                    ImGui::SetNextWindowSize({ 40, 0 });
                    ImGui::BeginTooltip();
                    ImGui::Text("%s", "");
                    ImGui::TextColored(colors.messageReact, "%s", "[+]");
                    ImGui::Text("%s", "");
                    int w = 0;
                    for (int i = 0; i < message.msg.reactUp; i++) {
                        const auto & username = users[i%users.size()].username;
                        ImGui::TextColored(colors.messageUser, "%s%s", username.c_str(),
                                           i == message.msg.reactUp - 1 ? "" : i == message.msg.reactUp - 2 ? " and" : ",");
                        if (w += username.size(); w < 20) {
                            ImGui::SameLine();
                        } else {
                            w = 0;
                        }
                    }
                    ImGui::Text("reacted with :+1:");
                    ImGui::Text("%s", "");
                    ImGui::EndTooltip();
                }
                ImGui::SameLine();
                ImGui::Text("%d", message.msg.reactUp);
            }

            if (message.msg.reactDown > 0) {
                if (message.msg.reactUp > 0) {
                    ImGui::SameLine();
                }
                ImGui::TextColored(colors.messageReact, "%s", "[-]");
                if (ImGui::IsItemHovered()) {
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, p0.y - 4 });
                    ImGui::SetNextWindowSize({ 40, 0 });
                    ImGui::BeginTooltip();
                    ImGui::Text("%s", "");
                    ImGui::TextColored(colors.messageReact, "%s", "[-]");
                    ImGui::Text("%s", "");
                    int w = 0;
                    for (int i = 0; i < message.msg.reactDown; i++) {
                        const auto & username = users[i%users.size()].username;
                        ImGui::TextColored(colors.messageUser, "%s%s", username.c_str(),
                                             i == message.msg.reactDown - 1 ? "" : i == message.msg.reactDown - 2 ? " and" : ",");
                        if (w += username.size(); w < 20) {
                            ImGui::SameLine();
                        } else {
                            w = 0;
                        }
                    }
                    ImGui::Text("reacted with :-1:");
                    ImGui::Text("%s", "");
                    ImGui::EndTooltip();
                }
                ImGui::SameLine();
                ImGui::Text("%d", message.msg.reactDown);
            }

            if (message.replies.size() > 0) {
                if (message.msg.reactUp > 0 || message.msg.reactDown > 0) {
                    ImGui::SameLine();
                    ImGui::Text("|");
                    ImGui::SameLine();
                }
                ImGui::TextColored(colors.messageReplies, "%d replies", (int) message.replies.size());
                if (ImGui::IsItemHovered()) {
                    ImGui::SameLine();
                    ImGui::SmallButton("View thread");
                    if (ImGui::IsMouseDown(0)) {
                        doReplyInThead = true;
                    }
                }
            }

            auto savePos = ImGui::GetCursorScreenPos();

            const int offsetX = isThread ? 7 : 12;

            ImGui::SetCursorScreenPos({ p1.x - offsetX, p0.y });
            ImGui::SmallButton("[+]");
            if (ImGui::IsItemHovered()) {
                if (ImGui::IsMouseReleased(0)) {
                    doUpvote = true;
                }
                ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, ImGui::GetIO().MousePos.y - 2 });
                ImGui::SetTooltip("React with +1");
            }

            if (!isThread) {
                ImGui::SameLine();
                ImGui::SmallButton("[>]");
                if (ImGui::IsItemHovered()) {
                    if (ImGui::IsMouseDown(0)) {
                        doReplyInThead = true;
                    }
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 16, ImGui::GetIO().MousePos.y - 2 });
                    ImGui::SetTooltip("Reply in thread");
                }
            }

            ImGui::SetCursorScreenPos(savePos);
        }

        if (doUpvote) {
            if (!isThread) {
                channels[selectedChannel].messages[i].msg.reactUp++;
            }
        }

        if (doReplyInThead) {
            showThreadPanel = true;
            threadChannel = selectedChannel;
            threadMessage = i;
        }

        ImGui::PopID();

        lastUid = uid;
    }

    ImGui::PopTextWrapPos();

    return true;
}